

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSchema
          (MessageGenerator *this,Printer *p,int offset)

{
  Descriptor *desc;
  initializer_list<google::protobuf::io::Printer::Sub> v_00;
  Sub *local_298;
  basic_string_view<char,_std::char_traits<char>_> local_260;
  undefined1 local_24a;
  allocator<char> local_249;
  string local_248;
  Sub *local_228;
  Sub local_220;
  iterator local_168;
  size_type local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_158 [2];
  Options local_138;
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  local_60;
  Span<const_google::protobuf::io::Printer::Sub> local_48;
  undefined1 local_38 [8];
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v;
  int offset_local;
  Printer *p_local;
  MessageGenerator *this_local;
  
  desc = this->descriptor_;
  v.storage_.callback_buffer_._12_4_ = offset;
  cpp::Options::Options(&local_138,&this->options_);
  cpp::anon_unknown_0::ClassVars(&local_60,desc,&local_138);
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,void,std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,int>
            ((Span<google::protobuf::io::Printer::Sub_const> *)&local_48,&local_60);
  io::Printer::WithVars
            ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_38,p,local_48);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector(&local_60);
  cpp::Options::~Options(&local_138);
  local_24a = 1;
  local_228 = &local_220;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"offset",&local_249);
  io::Printer::Sub::Sub<int&>(&local_220,&local_248,(int *)(v.storage_.callback_buffer_ + 0xc));
  local_24a = 0;
  local_168 = &local_220;
  local_160 = 1;
  v_00._M_len = 1;
  v_00._M_array = local_168;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_158[0]._M_local_buf,v_00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_260,"\n        {$offset$, sizeof($classtype$)},\n      ");
  io::Printer::SourceLocation::current();
  io::Printer::Emit(p,local_158[0]._M_allocated_capacity,local_158[0]._8_8_,local_260._M_len,
                    local_260._M_str);
  local_298 = (Sub *)&local_168;
  do {
    local_298 = local_298 + -1;
    io::Printer::Sub::~Sub(local_298);
  } while (local_298 != &local_220);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_38);
  return;
}

Assistant:

void MessageGenerator::GenerateSchema(io::Printer* p, int offset) {
  auto v = p->WithVars(ClassVars(descriptor_, options_));
  p->Emit(
      {
          {"offset", offset},
      },
      R"cc(
        {$offset$, sizeof($classtype$)},
      )cc");
}